

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractproxymodel.cpp
# Opt level: O0

QModelIndex * __thiscall
QAbstractProxyModel::sibling(QAbstractProxyModel *this,int row,int column,QModelIndex *idx)

{
  undefined4 in_ECX;
  undefined4 in_EDX;
  QModelIndex *in_RSI;
  QModelIndex *in_RDI;
  long in_FS_OFFSET;
  undefined1 local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QModelIndex::parent(in_RSI);
  (**(code **)(*(long *)in_RSI + 0x60))(in_RDI,in_RSI,in_EDX,in_ECX,local_20);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QModelIndex QAbstractProxyModel::sibling(int row, int column, const QModelIndex &idx) const
{
    return index(row, column, idx.parent());
}